

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC4_C(uint8_t *dst)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = dst + -1;
  uVar1 = 4;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar1 = uVar1 + dst[lVar3 + -0x20] + (uint)*pbVar2;
    pbVar2 = pbVar2 + 0x20;
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
    *(uint *)(dst + lVar3) = (uVar1 >> 3 & 0xff) * 0x1010101;
  }
  return;
}

Assistant:

static void DC4_C(uint8_t* dst) {   // DC
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += dst[i - BPS] + dst[-1 + i * BPS];
  dc >>= 3;
  for (i = 0; i < 4; ++i) memset(dst + i * BPS, dc, 4);
}